

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::anon_unknown_14::parseOption
               (int argc,char **argv,char *pattern,String *value,String *defaultVal)

{
  bool bVar1;
  long in_RCX;
  String *in_RDX;
  String *in_RSI;
  String *in_stack_00000038;
  char *in_stack_00000040;
  char **in_stack_00000048;
  int in_stack_00000050;
  undefined1 local_1;
  
  if (in_RCX != 0) {
    String::operator=(in_RSI,in_RDX);
  }
  bVar1 = parseOptionImpl(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038);
  if (bVar1) {
    local_1 = true;
  }
  else {
    local_1 = parseOptionImpl(in_stack_00000050,in_stack_00000048,in_stack_00000040,
                              in_stack_00000038);
  }
  return local_1;
}

Assistant:

bool parseOption(int argc, const char* const* argv, const char* pattern, String* value = nullptr,
                     const String& defaultVal = String()) {
        if(value)
            *value = defaultVal;
#ifndef DOCTEST_CONFIG_NO_UNPREFIXED_OPTIONS
        // offset (normally 3 for "dt-") to skip prefix
        if(parseOptionImpl(argc, argv, pattern + strlen(DOCTEST_CONFIG_OPTIONS_PREFIX), value))
            return true;
#endif // DOCTEST_CONFIG_NO_UNPREFIXED_OPTIONS
        return parseOptionImpl(argc, argv, pattern, value);
    }